

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

void __thiscall Address::Address(Address *this,Address *obj)

{
  Address *obj_local;
  Address *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->city);
  std::__cxx11::string::string((string *)&this->street);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->country,&obj->country);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->city,&obj->city);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->street,&obj->street);
  return;
}

Assistant:

Address::Address(const Address &obj) {
    this->country = obj.country;
    this->city = obj.city;
    this->street = obj.street;
}